

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

int Abc_FlowRetime_RefineConstraints(void)

{
  Abc_Ntk_t *pNtk_00;
  Flow_Data_t *pFVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  int maxTighten;
  Abc_Obj_t *pObj;
  int count;
  int flow;
  int i;
  Abc_Ntk_t *pNtk;
  
  pNtk_00 = pManMR->pNtk;
  pObj._4_4_ = 0;
  if (pManMR->fVerbose != 0) {
    printf("\t\tsubiter %d : constraints = {cons, exact} = %d, %d\n",
           (ulong)(uint)pManMR->subIteration,(ulong)(uint)pManMR->nConservConstraints,
           (ulong)(uint)pManMR->nExactConstraints);
  }
  pManMR->constraintMask = 0x90;
  if (pManMR->fVerbose != 0) {
    printf("\t\trefinement: over ");
  }
  fflush(_stdout);
  Abc_FlowRetime_PushFlows(pNtk_00,0);
  if (pManMR->fVerbose != 0) {
    printf("= %d ");
  }
  if (pManMR->fIsForward == 0) {
    for (count = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), count < iVar2; count = count + 1) {
      pAVar4 = Abc_NtkObj(pNtk_00,count);
      if ((pAVar4 != (Abc_Obj_t *)0x0) &&
         (pFVar1 = pManMR->pDataArray, uVar3 = Abc_ObjId(pAVar4),
         (undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x1) ==
         (undefined1  [24])0x0)) {
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffbf | 0x40;
      }
    }
  }
  else {
    for (count = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), count < iVar2; count = count + 1) {
      pAVar4 = Abc_NtkObj(pNtk_00,count);
      if ((pAVar4 != (Abc_Obj_t *)0x0) &&
         (pFVar1 = pManMR->pDataArray, uVar3 = Abc_ObjId(pAVar4),
         (undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x2) ==
         (undefined1  [24])0x0)) {
        *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffbf | 0x40;
      }
    }
  }
  if (pManMR->fConservTimingOnly == 0) {
    pManMR->constraintMask = 0x10;
    Abc_FlowRetime_ClearFlows(0);
    if (pManMR->fVerbose != 0) {
      printf("under = ");
    }
    fflush(_stdout);
    uVar3 = Abc_FlowRetime_PushFlows(pNtk_00,0);
    if (pManMR->fVerbose != 0) {
      printf("%d refined nodes = ",(ulong)uVar3);
    }
    fflush(_stdout);
    if (pManMR->fIsForward == 0) {
      for (count = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), count < iVar2; count = count + 1) {
        pAVar4 = Abc_NtkObj(pNtk_00,count);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          if (((((*(uint *)&pAVar4->field_0x14 >> 6 & 1) != 0) &&
               (pFVar1 = pManMR->pDataArray, uVar3 = Abc_ObjId(pAVar4),
               (undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x1) !=
               (undefined1  [24])0x0)) &&
              (pFVar1 = pManMR->pDataArray, uVar3 = Abc_ObjId(pAVar4),
              (undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x80) !=
              (undefined1  [24])0x0)) && ((int)pObj._4_4_ < 99999)) {
            pObj._4_4_ = pObj._4_4_ + 1;
            Abc_FlowRetime_ConstrainExact(pAVar4);
          }
          *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffbf;
        }
      }
    }
    else {
      for (count = 0; iVar2 = Vec_PtrSize(pNtk_00->vObjs), count < iVar2; count = count + 1) {
        pAVar4 = Abc_NtkObj(pNtk_00,count);
        if (pAVar4 != (Abc_Obj_t *)0x0) {
          if ((((*(uint *)&pAVar4->field_0x14 >> 6 & 1) != 0) &&
              (pFVar1 = pManMR->pDataArray, uVar3 = Abc_ObjId(pAVar4),
              (undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x2) !=
              (undefined1  [24])0x0)) &&
             ((pFVar1 = pManMR->pDataArray, uVar3 = Abc_ObjId(pAVar4),
              (undefined1  [24])((undefined1  [24])pFVar1[uVar3] & (undefined1  [24])0x80) !=
              (undefined1  [24])0x0 && ((int)pObj._4_4_ < 99999)))) {
            pObj._4_4_ = pObj._4_4_ + 1;
            Abc_FlowRetime_ConstrainExact(pAVar4);
          }
          *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffbf;
        }
      }
    }
    if (pManMR->fVerbose != 0) {
      printf("%d\n",(ulong)pObj._4_4_);
    }
    pNtk._4_4_ = (uint)(0 < (int)pObj._4_4_);
  }
  else {
    if (pManMR->fVerbose != 0) {
      printf(" done\n");
    }
    pNtk._4_4_ = 0;
  }
  return pNtk._4_4_;
}

Assistant:

int Abc_FlowRetime_RefineConstraints( ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  int i, flow, count = 0;
  Abc_Obj_t *pObj;
  int maxTighten = 99999;

  vprintf("\t\tsubiter %d : constraints = {cons, exact} = %d, %d\n", 
         pManMR->subIteration, pManMR->nConservConstraints, pManMR->nExactConstraints);

  // 1. overconstrained
  pManMR->constraintMask = BLOCK | CONSERVATIVE;
  vprintf("\t\trefinement: over ");
  fflush(stdout);
  flow = Abc_FlowRetime_PushFlows( pNtk, 0 );
  vprintf("= %d ", flow);

  // remember nodes
  if (pManMR->fIsForward) {
    Abc_NtkForEachObj( pNtk, pObj, i )
      if (!FTEST(pObj, VISITED_R))
        pObj->fMarkC = 1;
  } else {
    Abc_NtkForEachObj( pNtk, pObj, i )
      if (!FTEST(pObj, VISITED_E))
        pObj->fMarkC = 1;
  }

  if (pManMR->fConservTimingOnly) {
    vprintf(" done\n");
    return 0;
  }

  // 2. underconstrained
  pManMR->constraintMask = BLOCK;
  Abc_FlowRetime_ClearFlows( 0 );
  vprintf("under = ");
  fflush(stdout);
  flow = Abc_FlowRetime_PushFlows( pNtk, 0 );
  vprintf("%d refined nodes = ", flow);
  fflush(stdout);

  // find area-limiting constraints
  if (pManMR->fIsForward) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      if (pObj->fMarkC &&
          FTEST(pObj, VISITED_R) &&
          FTEST(pObj, CONSERVATIVE) && 
          count < maxTighten) {
        count++;
        Abc_FlowRetime_ConstrainExact( pObj );
      }
      pObj->fMarkC = 0;
    }
  } else {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      if (pObj->fMarkC &&
          FTEST(pObj, VISITED_E) &&
          FTEST(pObj, CONSERVATIVE) &&
          count < maxTighten) {
        count++;
        Abc_FlowRetime_ConstrainExact( pObj );
      }
      pObj->fMarkC = 0;
    }
  }
  
  vprintf("%d\n", count);
  
  return (count > 0);
}